

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O2

int check(char *a)

{
  char cVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  
  r = svstatus_get();
  if (r == -1) {
    iVar4 = -1;
  }
  else {
    iVar4 = 0;
    for (; uVar2 = svstatus._12_4_, cVar1 = *a, cVar1 != '\0'; a = a + 1) {
      if (r == 0) {
        return (uint)(cVar1 == 'x') * 2 + -1;
      }
      switch(cVar1) {
      case 'k':
      case 't':
        if ((svstatus._12_4_ != 0) || (svstatus[0x11] != 'd')) {
          tai_unpack(svstatus,&tstatus);
          if (uVar2 == 0) {
            return 0;
          }
          if (tstatus.x < tstart.sec.x) {
            return 0;
          }
          if (svstatus[0x12] != '\0') {
            return 0;
          }
          goto LAB_00102b9f;
        }
        break;
      case 'l':
      case 'm':
      case 'n':
      case 'q':
      case 'r':
      case 's':
      case 'v':
      case 'w':
        break;
      case 'o':
        tai_unpack(svstatus,&tstatus);
        if (uVar2 == 0) {
          if (tstatus.x < tstart.sec.x) {
            return 0;
          }
        }
        else if (svstatus[0x11] != 'd') {
          return 0;
        }
        break;
      case 'p':
        if ((svstatus._12_4_ != 0) && (svstatus[0x10] == '\0')) {
          return 0;
        }
        break;
      case 'u':
        if (svstatus._12_4_ == 0) {
          return 0;
        }
        if (svstatus[0x13] != '\x01') {
          return 0;
        }
LAB_00102b9f:
        iVar3 = checkscript();
        if (iVar3 == 0) {
          return 0;
        }
        break;
      case 'x':
        goto switchD_00102add_caseD_78;
      default:
        if (cVar1 == 'C') {
          if (svstatus._12_4_ != 0) goto LAB_00102b9f;
        }
        else if (cVar1 == 'c') {
          cVar1 = svstatus[0x10];
          if (svstatus._12_4_ != 0) goto joined_r0x00102b97;
        }
        else if (cVar1 == 'd') {
          cVar1 = svstatus[0x13];
          if (svstatus._12_4_ != 0) {
            return 0;
          }
joined_r0x00102b97:
          if (cVar1 != '\0') {
            return 0;
          }
        }
      }
    }
    outs("ok: ");
    svstatus_print(*service);
    flush("\n");
    iVar4 = 1;
  }
switchD_00102add_caseD_78:
  return iVar4;
}

Assistant:

int check(char *a) {
  unsigned int pid;

  if ((r =svstatus_get()) == -1) return(-1);
  while (*a) {
    if (r == 0) { if (*a == 'x') return(1); return(-1); }
    pid =(unsigned char)svstatus[15];
    pid <<=8; pid +=(unsigned char)svstatus[14];
    pid <<=8; pid +=(unsigned char)svstatus[13];
    pid <<=8; pid +=(unsigned char)svstatus[12];
    switch (*a) {
    case 'x': return(0);
    case 'u':
      if (!pid || svstatus[19] != 1) return(0);
      if (!checkscript()) return(0);
      break;
    case 'd': if (pid || svstatus[19] != 0) return(0); break;
    case 'C': if (pid) if (!checkscript()) return(0); break;
    case 't':
    case 'k':
      if (!pid && svstatus[17] == 'd') break;
      tai_unpack(svstatus, &tstatus);
      if ((tstart.sec.x > tstatus.x) || !pid || svstatus[18] || !checkscript())
        return(0);
      break;
    case 'o':
      tai_unpack(svstatus, &tstatus);
      if ((!pid && tstart.sec.x > tstatus.x) || (pid && svstatus[17] != 'd'))
        return(0);
      break;
    case 'p': if (pid && !svstatus[16]) return(0); break;
    case 'c': if (pid && svstatus[16]) return(0); break;
    }
    ++a;
  }
  outs(OK); svstatus_print(*service); flush("\n");
  return(1);
}